

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeNF
          (ChElementBeamANCF_3333 *this,double xi,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  scalar_constant_op<double> sVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  uint i;
  long index;
  long index_00;
  RealScalar RVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChVectorN<double,_3> M_scaled;
  ChMatrix33<double> J_Cxi_Inv;
  undefined1 local_758 [16];
  XprTypeNested pMStack_748;
  variable_if_dynamic<long,__1> vStack_740;
  variable_if_dynamic<long,__1> vStack_738;
  double dStack_730;
  double dStack_728;
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_718;
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_6e8;
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_6b8;
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_688;
  undefined1 local_658 [16];
  XprTypeNested pMStack_648;
  variable_if_dynamic<long,__1> vStack_640;
  variable_if_dynamic<long,__1> vStack_638;
  double dStack_630;
  XprTypeNested pMStack_628;
  scalar_constant_op<double> local_620;
  undefined1 local_610 [16];
  XprTypeNested pMStack_600;
  variable_if_dynamic<long,__1> vStack_5f8;
  variable_if_dynamic<long,__1> vStack_5f0;
  XprTypeNested pMStack_5e8;
  scalar_constant_op<double> local_5d8;
  PointerType local_5c8;
  PointerType pdStack_5c0;
  XprTypeNested pMStack_5b8;
  XprTypeNested pMStack_5b0;
  long lStack_5a8;
  Index IStack_5a0;
  XprTypeNested pMStack_598;
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_588;
  Map<Eigen::Matrix<double,_27,_1,_0,_27,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  VectorN G_C;
  undefined1 local_500 [24];
  scalar_constant_op<double> sStack_4e8;
  variable_if_dynamic<long,__1> local_4e0;
  variable_if_dynamic<long,__1> vStack_4d8;
  double dStack_4d0;
  XprTypeNested pMStack_4c8;
  double local_4b8;
  PointerType local_4a8;
  XprTypeNested pMStack_4a0;
  XprTypeNested pMStack_498;
  double dStack_490;
  double dStack_488;
  XprTypeNested pMStack_480;
  double local_470;
  PointerType local_458;
  double dStack_450;
  XprTypeNested pMStack_448;
  XprTypeNested pMStack_440;
  double dStack_438;
  XprTypeNested pMStack_430;
  double local_420;
  MatrixNx3c Sxi_D;
  VectorN G_B;
  ChMatrix33<double> J_Cxi;
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> local_2a0;
  VectorN G_A;
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  MatrixNx3 QiCompact;
  
  Calc_Sxi_compact(this,&Sxi_compact,xi,0.0,0.0);
  index_00 = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&e_bar,F,0,3);
  vStack_4d8.m_value =
       (long)e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
             array[4];
  dStack_4d0 = e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
               array[5];
  pMStack_4c8 = (XprTypeNested)
                e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
                array[6];
  local_500._8_8_ =
       e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[0];
  local_500._16_8_ =
       e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[1];
  sStack_4e8.m_other =
       e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[2];
  local_4e0.m_value =
       (long)e_bar.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
             array[3];
  local_500._0_8_ = (XprTypeNested)&Sxi_compact;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,9,3,1,9,3>,Eigen::Product<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
            (&QiCompact,
             (Product<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
              *)local_500);
  QiReshaped._0_8_ = &QiCompact;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,27,1,0,27,1>,0,Eigen::Stride<0,0>>>
            (Qi,&QiReshaped);
  CalcCoordMatrix(this,&e_bar);
  Calc_Sxi_D(this,&Sxi_D,xi,0.0,0.0);
  J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&J_Cxi;
  local_500._0_8_ = &e_bar;
  local_500._8_8_ = &Sxi_D;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)&J_Cxi_Inv,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
              *)local_500);
  local_500._0_8_ = &J_Cxi;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            (&J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>,
             (Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_500);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true> *)
                  local_758,&Sxi_D,0);
  lStack_5a8 = vStack_738.m_value;
  IStack_5a0 = (Index)dStack_730;
  local_5c8 = (PointerType)local_758._0_8_;
  pdStack_5c0 = (PointerType)local_758._8_8_;
  pMStack_5b8 = pMStack_748;
  pMStack_5b0 = (XprTypeNested)vStack_740.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)&G_B,(MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>
                     *)&local_5c8,(double *)&J_Cxi_Inv);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_6b8,&Sxi_D,1);
  local_688.m_startCol.m_value = local_6b8.m_startCol.m_value;
  local_688.m_outerStride = local_6b8.m_outerStride;
  local_688.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_6b8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_688.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_6b8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_688.m_xpr = local_6b8.m_xpr;
  local_688.m_startRow.m_value = local_6b8.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)&G_C,(MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>
                     *)&local_688,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 3)
  ;
  dVar5 = G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7]
  ;
  M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0];
  M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1];
  local_658._8_8_ =
       G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0];
  pMStack_648 = (XprTypeNested)
                G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[1];
  vStack_640.m_value =
       (long)G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [2];
  vStack_638.m_value =
       (long)G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [3];
  dStack_630 = G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
               array[4];
  pMStack_628 = (XprTypeNested)
                G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[5];
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_718,&Sxi_D,2);
  local_6e8.m_startCol.m_value = local_718.m_startCol.m_value;
  local_6e8.m_outerStride = local_718.m_outerStride;
  local_6e8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_718.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_6e8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_718.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_6e8.m_xpr = local_718.m_xpr;
  local_6e8.m_startRow.m_value = local_718.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)local_610,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>> *)
            &local_6e8,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6)
  ;
  dStack_4d0 = G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
               array[4];
  pMStack_4c8 = (XprTypeNested)
                G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[5];
  local_500._16_8_ =
       M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  sStack_4e8.m_other =
       M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  local_4e0.m_value =
       (long)G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [2];
  vStack_4d8.m_value =
       (long)G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [3];
  local_4b8 = G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
              array[7];
  local_4a8 = (PointerType)local_658._8_8_;
  pMStack_4a0 = pMStack_648;
  pMStack_498 = (XprTypeNested)vStack_640.m_value;
  dStack_490 = (double)vStack_638.m_value;
  dStack_488 = dStack_630;
  pMStack_480 = pMStack_628;
  local_470 = dVar5;
  local_458 = (PointerType)local_610._0_8_;
  dStack_450 = (double)local_610._8_8_;
  pMStack_448 = pMStack_600;
  pMStack_440 = (XprTypeNested)vStack_5f8.m_value;
  dStack_438 = (double)vStack_5f0.m_value;
  pMStack_430 = pMStack_5e8;
  local_420 = local_5d8.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>> *)&G_A,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>_>
              *)local_500);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_688,&Sxi_D,0);
  vStack_738.m_value = local_688.m_startCol.m_value;
  dStack_730 = (double)local_688.m_outerStride;
  local_758._0_8_ =
       local_688.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_758._8_8_ =
       local_688.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  pMStack_748 = local_688.m_xpr;
  vStack_740.m_value = local_688.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)&G_C,(MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>
                     *)local_758,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1)
  ;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_6e8,&Sxi_D,1);
  local_6b8.m_startCol.m_value = local_6e8.m_startCol.m_value;
  local_6b8.m_outerStride = local_6e8.m_outerStride;
  local_6b8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_6e8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_6b8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_6e8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_6b8.m_xpr = local_6e8.m_xpr;
  local_6b8.m_startRow.m_value = local_6e8.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)local_610,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>> *)
            &local_6b8,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4)
  ;
  sVar7.m_other = local_5d8.m_other;
  dStack_630 = G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
               array[4];
  pMStack_628 = (XprTypeNested)
                G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[5];
  local_658._8_8_ =
       G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0];
  pMStack_648 = (XprTypeNested)
                G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[1];
  vStack_640.m_value =
       (long)G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [2];
  vStack_638.m_value =
       (long)G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [3];
  pdStack_5c0 = (PointerType)local_610._0_8_;
  pMStack_5b8 = (XprTypeNested)local_610._8_8_;
  pMStack_5b0 = pMStack_600;
  lStack_5a8 = vStack_5f8.m_value;
  IStack_5a0 = vStack_5f0.m_value;
  pMStack_598 = pMStack_5e8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_588,&Sxi_D,2);
  local_718.m_startCol.m_value = local_588.m_startCol.m_value;
  local_718.m_outerStride = local_588.m_outerStride;
  local_718.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_588.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_718.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_588.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_718.m_xpr = local_588.m_xpr;
  local_718.m_startRow.m_value = local_588.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)&M_scaled,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>> *)
            &local_718,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 7)
  ;
  dStack_4d0 = dStack_630;
  pMStack_4c8 = pMStack_628;
  local_500._16_8_ = local_658._8_8_;
  sStack_4e8.m_other = (double)pMStack_648;
  local_4e0.m_value = vStack_640.m_value;
  vStack_4d8.m_value = vStack_638.m_value;
  local_4b8 = G_C.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
              array[7];
  local_4a8 = pdStack_5c0;
  pMStack_4a0 = pMStack_5b8;
  pMStack_498 = pMStack_5b0;
  dStack_490 = (double)lStack_5a8;
  dStack_488 = (double)IStack_5a0;
  pMStack_480 = pMStack_598;
  local_470 = sVar7.m_other;
  local_458 = (PointerType)
              M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0];
  dStack_450 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
  pMStack_448 = (XprTypeNested)
                M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2];
  pMStack_440 = (XprTypeNested)
                G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[2];
  dStack_438 = G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
               array[3];
  pMStack_430 = (XprTypeNested)
                G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array[4];
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>> *)&G_B,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>_>
              *)local_500);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_6b8,&Sxi_D,0);
  local_688.m_startCol.m_value = local_6b8.m_startCol.m_value;
  local_688.m_outerStride = local_6b8.m_outerStride;
  local_688.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_6b8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_688.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_6b8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_688.m_xpr = local_6b8.m_xpr;
  local_688.m_startRow.m_value = local_6b8.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)local_610,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>> *)
            &local_688,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2)
  ;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_718,&Sxi_D,1);
  local_6e8.m_startCol.m_value = local_718.m_startCol.m_value;
  local_6e8.m_outerStride = local_718.m_outerStride;
  local_6e8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_718.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_6e8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_718.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_6e8.m_xpr = local_718.m_xpr;
  local_6e8.m_startRow.m_value = local_718.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)&M_scaled,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>> *)
            &local_6e8,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5)
  ;
  IStack_5a0 = vStack_5f0.m_value;
  pMStack_598 = pMStack_5e8;
  pdStack_5c0 = (PointerType)local_610._0_8_;
  pMStack_5b8 = (XprTypeNested)local_610._8_8_;
  pMStack_5b0 = pMStack_600;
  lStack_5a8 = vStack_5f8.m_value;
  local_758._8_8_ =
       M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  pMStack_748 = (XprTypeNested)
                M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1];
  vStack_740.m_value =
       (long)M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2];
  vStack_738.m_value =
       (long)G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
             [2];
  dStack_730 = G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
               array[3];
  dStack_728 = G_B.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
               array[4];
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true,_true>::
  BlockImpl_dense(&local_2a0,&Sxi_D,2);
  local_588.m_startCol.m_value = local_2a0.m_startCol.m_value;
  local_588.m_outerStride = local_2a0.m_outerStride;
  local_588.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data =
       local_2a0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>.m_data;
  local_588.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_ =
       local_2a0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>,_0>._8_8_;
  local_588.m_xpr = local_2a0.m_xpr;
  local_588.m_startRow.m_value = local_2a0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
             *)local_658,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>> *)
            &local_588,
            J_Cxi_Inv.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8)
  ;
  dStack_4d0 = (double)IStack_5a0;
  pMStack_4c8 = pMStack_598;
  local_500._16_8_ = pdStack_5c0;
  sStack_4e8.m_other = (double)pMStack_5b8;
  local_4e0.m_value = (long)pMStack_5b0;
  vStack_4d8.m_value = lStack_5a8;
  local_4b8 = local_5d8.m_other;
  local_4a8 = (PointerType)local_758._8_8_;
  pMStack_4a0 = pMStack_748;
  pMStack_498 = (XprTypeNested)vStack_740.m_value;
  dStack_490 = (double)vStack_738.m_value;
  dStack_488 = dStack_730;
  pMStack_480 = (XprTypeNested)dStack_728;
  local_458 = (PointerType)local_658._0_8_;
  dStack_450 = (double)local_658._8_8_;
  pMStack_448 = pMStack_648;
  pMStack_440 = (XprTypeNested)vStack_640.m_value;
  dStack_438 = (double)vStack_638.m_value;
  pMStack_430 = (XprTypeNested)dStack_630;
  local_420 = local_620.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,9,1,0,9,1>> *)&G_C,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>_>
              *)local_500);
  local_658._0_8_ = (PointerType)0x3fe0000000000000;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_610,F,3,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)local_500,(double *)local_658,(StorageBaseType *)local_610);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&M_scaled,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)local_500);
  for (index = 0;
      dVar5 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1], index != 9; index = index + 1) {
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&G_C,index);
    dVar6 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&G_B,index);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar5;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar6 * *pSVar8;
    auVar2 = vfmsub231sd_fma(auVar14,auVar11,auVar2);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index_00);
    dVar6 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
    *pSVar9 = auVar2._0_8_ + *pSVar9;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&G_A,index);
    dVar5 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&G_C,index);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar6;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar5 * *pSVar8;
    auVar2 = vfmsub231sd_fma(auVar15,auVar12,auVar3);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,
                        index_00 + 1);
    dVar5 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
    *pSVar9 = auVar2._0_8_ + *pSVar9;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&G_B,index);
    dVar6 = M_scaled.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)&G_A,index);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar6 * *pSVar8;
    auVar2 = vfmsub231sd_fma(auVar16,auVar13,auVar4);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,
                        index_00 + 2);
    index_00 = index_00 + 3;
    *pSVar9 = auVar2._0_8_ + *pSVar9;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  local_500,&J_Cxi.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  RVar10 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_>
                       *)local_500);
  *detJ = RVar10;
  return;
}

Assistant:

void ChElementBeamANCF_3333::ComputeNF(
    const double xi,             // parametric coordinate along the beam axis
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, 0, 0);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
        Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
        Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
        Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential length and the normalized differential length.  The vector 2 norm is used to calculate this
    //  length ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.col(0).norm();
}